

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmake.cpp
# Opt level: O1

void __thiscall CTcMake::add_pp_def(CTcMake *this,char *sym,char *expan,int is_def)

{
  CTcMakeDef *this_00;
  CTcMakeDef *pCVar1;
  
  this_00 = (CTcMakeDef *)operator_new(0x20);
  CTcMakeDef::CTcMakeDef(this_00,sym,expan,is_def);
  pCVar1 = (CTcMakeDef *)&this->def_head_;
  if (this->def_tail_ != (CTcMakeDef *)0x0) {
    pCVar1 = this->def_tail_;
  }
  pCVar1->nxt_ = this_00;
  this->def_tail_ = this_00;
  return;
}

Assistant:

void CTcMake::add_pp_def(const char *sym, const char *expan, int is_def)
{
    CTcMakeDef *def;

    /* create the new list entry */
    def = new CTcMakeDef(sym, expan, is_def);

    /* link it in at the end of our list */
    if (def_tail_ != 0)
        def_tail_->set_next(def);
    else
        def_head_ = def;
    def_tail_ = def;
}